

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264d_vdpu34x.c
# Opt level: O1

MPP_RET vdpu34x_h264d_control(void *hal,MpiCmd cmd_type,void *param)

{
  MppFrameFormat MVar1;
  RK_U32 RVar2;
  RK_U32 RVar3;
  
  if (hal == (void *)0x0) {
    if (((byte)hal_h264d_debug & 4) != 0) {
      _mpp_log_l(4,"hal_h264d_vdpu34x","input empty(%d).\n",(char *)0x0,0x4a4);
    }
  }
  else if (cmd_type == MPP_DEC_SET_FRAME_INFO) {
    MVar1 = mpp_frame_get_fmt(param);
    RVar2 = mpp_frame_get_width(param);
    RVar3 = mpp_frame_get_height(param);
    _mpp_log_l(4,"hal_h264d_vdpu34x","control info: fmt %d, w %d, h %d\n",(char *)0x0,(ulong)MVar1,
               (ulong)RVar2,RVar3);
    if (MVar1 == MPP_FMT_YUV422SP) {
      mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x50),SLOTS_LEN_ALIGN,rkv_len_align_422);
    }
    if ((MVar1 & 0xf00000) == MPP_FMT_YUV420SP) {
      if (0x780 < RVar2 || 0x440 < RVar3) {
        mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x50),SLOTS_HOR_ALIGN,rkv_hor_align_256_odds
                          );
      }
    }
    else {
      vdpu34x_afbc_align_calc(*(MppBufSlots *)((long)hal + 0x50),param,0x10);
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET vdpu34x_h264d_control(void *hal, MpiCmd cmd_type, void *param)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dHalCtx_t *p_hal = (H264dHalCtx_t *)hal;

    INP_CHECK(ret, NULL == p_hal);

    switch ((MpiCmd)cmd_type) {
    case MPP_DEC_SET_FRAME_INFO: {
        MppFrameFormat fmt = mpp_frame_get_fmt((MppFrame)param);
        RK_U32 imgwidth = mpp_frame_get_width((MppFrame)param);
        RK_U32 imgheight = mpp_frame_get_height((MppFrame)param);

        mpp_log("control info: fmt %d, w %d, h %d\n", fmt, imgwidth, imgheight);
        if (fmt == MPP_FMT_YUV422SP) {
            mpp_slots_set_prop(p_hal->frame_slots, SLOTS_LEN_ALIGN, rkv_len_align_422);
        }
        if (MPP_FRAME_FMT_IS_FBC(fmt)) {
            vdpu34x_afbc_align_calc(p_hal->frame_slots, (MppFrame)param, 16);
        } else if (imgwidth > 1920 || imgheight > 1088) {
            mpp_slots_set_prop(p_hal->frame_slots, SLOTS_HOR_ALIGN, rkv_hor_align_256_odds);
        }
        break;
    }
    case MPP_DEC_SET_OUTPUT_FORMAT: {

    } break;
    default:
        break;
    }

__RETURN:
    return ret = MPP_OK;
}